

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O2

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint size;
  uint size_00;
  int iVar1;
  uint size_01;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int i_1;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int stride;
  float *pfVar10;
  int i;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  
  uVar8 = bottom_top_blob->dims;
  size = bottom_top_blob->h;
  size_00 = bottom_top_blob->w;
  size_01 = bottom_top_blob->d;
  uVar4 = bottom_top_blob->c;
  uVar2 = (ulong)uVar4;
  iVar3 = (this->axis >> 0x1f & uVar8) + this->axis;
  if (uVar8 == 1) {
    softmax((float *)bottom_top_blob->data,size_00);
    bVar17 = iVar3 == 0;
    bVar16 = false;
  }
  else {
    bVar17 = iVar3 == 0;
    bVar16 = uVar8 == 2;
    if ((bVar16) && (iVar3 == 0)) {
      lVar9 = 0;
      uVar5 = 0;
      if (0 < (int)size_00) {
        uVar5 = (ulong)size_00;
      }
      for (; uVar5 * 4 != lVar9; lVar9 = lVar9 + 4) {
        softmax((float *)((long)bottom_top_blob->data + lVar9),size,size_00);
      }
      bVar17 = true;
      bVar16 = true;
    }
    if ((bVar16) && (iVar3 == 1)) {
      uVar5 = 0;
      uVar13 = 0;
      if (0 < (int)size) {
        uVar13 = (ulong)size;
      }
      for (; uVar13 != uVar5; uVar5 = uVar5 + 1) {
        softmax((float *)((long)bottom_top_blob->w * uVar5 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data),size_00);
      }
    }
    bVar16 = uVar8 == 3;
    if ((bool)(bVar16 & bVar17)) {
      uVar13 = 0;
      uVar5 = (ulong)(size * size_00);
      if ((int)(size * size_00) < 1) {
        uVar5 = uVar13;
      }
      for (; uVar5 * 4 != uVar13; uVar13 = uVar13 + 4) {
        softmax((float *)((long)bottom_top_blob->data + uVar13),uVar4,(int)bottom_top_blob->cstep);
      }
    }
  }
  if ((bVar16) && (iVar3 == 1)) {
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)size_00) {
      uVar7 = size_00;
    }
    uVar13 = 0;
    if (0 < (int)uVar4) {
      uVar13 = uVar2;
    }
    for (; uVar5 != uVar13; uVar5 = uVar5 + 1) {
      pfVar10 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      uVar11 = uVar7;
      while (bVar15 = uVar11 != 0, uVar11 = uVar11 - 1, bVar15) {
        softmax(pfVar10,size,size_00);
        pfVar10 = pfVar10 + 1;
      }
    }
  }
  if ((bool)(bVar16 & iVar3 == 2)) {
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)size) {
      uVar7 = size;
    }
    uVar13 = 0;
    if (0 < (int)uVar4) {
      uVar13 = uVar2;
    }
    for (; uVar5 != uVar13; uVar5 = uVar5 + 1) {
      pfVar10 = (float *)(bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar5 +
                         (long)bottom_top_blob->data);
      uVar11 = uVar7;
      while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
        softmax(pfVar10,size_00);
        pfVar10 = pfVar10 + (int)size_00;
      }
    }
  }
  if ((bool)(uVar8 == 4 & bVar17)) {
    uVar7 = size * size_00 * size_01;
    uVar13 = 0;
    uVar5 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar5 = uVar13;
    }
    for (; uVar5 * 4 != uVar13; uVar13 = uVar13 + 4) {
      softmax((float *)((long)bottom_top_blob->data + uVar13),uVar4,(int)bottom_top_blob->cstep);
    }
  }
  if (uVar8 == 4 && iVar3 == 1) {
    stride = size * size_00;
    uVar5 = 0;
    iVar1 = 0;
    if (0 < stride) {
      iVar1 = stride;
    }
    uVar13 = 0;
    if (0 < (int)uVar4) {
      uVar13 = uVar2;
    }
    for (; uVar5 != uVar13; uVar5 = uVar5 + 1) {
      pfVar10 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      iVar12 = iVar1;
      while (bVar16 = iVar12 != 0, iVar12 = iVar12 + -1, bVar16) {
        softmax(pfVar10,size_01,stride);
        pfVar10 = pfVar10 + 1;
      }
    }
  }
  if ((uVar8 == 4) && (iVar3 == 2)) {
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)size_00) {
      uVar7 = size_00;
    }
    uVar13 = 0;
    if (0 < (int)size_01) {
      uVar13 = (ulong)size_01;
    }
    uVar6 = 0;
    if (0 < (int)uVar4) {
      uVar6 = uVar2;
    }
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
        pfVar10 = (float *)((long)bottom_top_blob->data +
                           (long)bottom_top_blob->h * bottom_top_blob->elemsize *
                           (long)bottom_top_blob->w * uVar14 +
                           bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize);
        uVar11 = uVar7;
        while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
          softmax(pfVar10,size,size_00);
          pfVar10 = pfVar10 + 1;
        }
      }
    }
  }
  if ((uVar8 == 4) && (iVar3 == 3)) {
    uVar5 = 0;
    if ((int)size < 1) {
      size = 0;
    }
    if ((int)size_01 < 1) {
      size_01 = 0;
    }
    if ((int)uVar4 < 1) {
      uVar2 = uVar5;
    }
    for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
      pfVar10 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      for (uVar8 = 0; uVar4 = size, uVar8 != size_01; uVar8 = uVar8 + 1) {
        while (bVar16 = uVar4 != 0, uVar4 = uVar4 - 1, bVar16) {
          softmax(pfVar10,size_00);
          pfVar10 = pfVar10 + (int)size_00;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = expf( value - global max value )
    // sum all value
    // value = value / sum

    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        float* ptr = bottom_top_blob;

        softmax(ptr, w);
    }

    if (dims == 2 && positive_axis == 0)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, h, w);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            softmax(ptr, w);
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        const int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, channels, bottom_top_blob.cstep);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                softmax(ptr, h, w);
                ptr += 1;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                softmax(ptr, w);
                ptr += w;
            }
        }
    }

    if (dims == 4 && positive_axis == 0)
    {
        const int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, channels, bottom_top_blob.cstep);
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < w * h; i++)
            {
                softmax(ptr, d, w * h);
                ptr += 1;
            }
        }
    }

    if (dims == 4 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            for (int i = 0; i < d; i++)
            {
                float* ptr = bottom_top_blob.channel(q).depth(i);

                for (int j = 0; j < w; j++)
                {
                    softmax(ptr, h, w);
                    ptr += 1;
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    softmax(ptr, w);
                    ptr += w;
                }
            }
        }
    }

    return 0;
}